

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::simplify_impl<viennamath::rt_expression_interface<double>,double>
          (rt_expression_interface<double> *lhs,double param_2)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  rt_constant<double,_viennamath::rt_expression_interface<double>_> *prVar4;
  rt_expression_interface<double> *prVar5;
  undefined4 extraout_var_01;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *prVar6;
  undefined4 extraout_var_02;
  op_interface_type *poVar7;
  double extraout_XMM0_Qa;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_d0;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_c0;
  rt_expr<viennamath::rt_expression_interface<double>_> local_60;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *local_58;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *rhs_vec;
  rt_vector_expr<viennamath::rt_expression_interface<double>_> *lhs_vec;
  double val_1;
  double local_30;
  double val;
  rt_expression_interface<double> *rhs_local;
  rt_expression_interface<double> *lhs_local;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *local_10;
  
  val = param_2;
  rhs_local = lhs;
  uVar1 = (*lhs->_vptr_rt_expression_interface[8])();
  if ((uVar1 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)val + 0x40))();
    if ((uVar3 & 1) == 0) {
      if (rhs_local == (rt_expression_interface<double> *)0x0) {
        local_c0 = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)0x0;
      }
      else {
        local_c0 = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                   __dynamic_cast(rhs_local,&rt_expression_interface<double>::typeinfo,
                                  &rt_vector_expr<viennamath::rt_expression_interface<double>>::
                                   typeinfo,0);
      }
      rhs_vec = local_c0;
      if (val == 0.0) {
        local_d0 = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)0x0;
      }
      else {
        local_d0 = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                   __dynamic_cast(val,&rt_expression_interface<double>::typeinfo,
                                  &rt_vector_expr<viennamath::rt_expression_interface<double>>::
                                   typeinfo,0);
      }
      local_58 = local_d0;
      if ((rhs_vec == (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)0x0) ||
         (local_d0 == (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)0x0)) {
        prVar6 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
        iVar2 = (*rhs_local->_vptr_rt_expression_interface[0x10])();
        poVar7 = (op_interface_type *)operator_new(8);
        poVar7->_vptr_op_interface = (_func_int **)0x0;
        op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::
        op_binary((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>
                   *)poVar7);
        prVar5 = (rt_expression_interface<double> *)(**(code **)(*(long *)val + 0x80))();
        rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                  (prVar6,(rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar2),poVar7,
                   prVar5);
        local_10 = prVar6;
      }
      else {
        operator*((viennamath *)&local_60,rhs_vec,local_d0);
        prVar5 = rt_expr<viennamath::rt_expression_interface<double>_>::get(&local_60);
        iVar2 = (*prVar5->_vptr_rt_expression_interface[2])();
        local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                   CONCAT44(extraout_var_01,iVar2);
        rt_expr<viennamath::rt_expression_interface<double>_>::~rt_expr(&local_60);
      }
    }
    else {
      lhs_vec = (rt_vector_expr<viennamath::rt_expression_interface<double>_> *)
                (**(code **)(*(long *)val + 0x48))();
      if (((double)lhs_vec != 0.0) || (NAN((double)lhs_vec))) {
        if (((double)lhs_vec != 1.0) || (NAN((double)lhs_vec))) {
          prVar6 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                   operator_new(0x20);
          iVar2 = (*rhs_local->_vptr_rt_expression_interface[0x10])();
          poVar7 = (op_interface_type *)operator_new(8);
          poVar7->_vptr_op_interface = (_func_int **)0x0;
          op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::
          op_binary((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>
                     *)poVar7);
          prVar4 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                   operator_new(0x10);
          rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
                    (prVar4,(double)lhs_vec);
          rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                    (prVar6,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                     poVar7,(rt_expression_interface<double> *)prVar4);
          local_10 = prVar6;
        }
        else {
          iVar2 = (*rhs_local->_vptr_rt_expression_interface[0x10])();
          local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                     CONCAT44(extraout_var,iVar2);
        }
      }
      else {
        prVar6 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
        rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
                  ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)prVar6,0.0);
        local_10 = prVar6;
      }
    }
  }
  else {
    (*rhs_local->_vptr_rt_expression_interface[9])();
    if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
      if ((extraout_XMM0_Qa != 1.0) || (NAN(extraout_XMM0_Qa))) {
        local_30 = extraout_XMM0_Qa;
        prVar6 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
        prVar4 = (rt_constant<double,_viennamath::rt_expression_interface<double>_> *)
                 operator_new(0x10);
        rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
                  (prVar4,local_30);
        poVar7 = (op_interface_type *)operator_new(8);
        poVar7->_vptr_op_interface = (_func_int **)0x0;
        op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>::
        op_binary((op_binary<viennamath::op_mult<double>,_viennamath::rt_expression_interface<double>_>
                   *)poVar7);
        prVar5 = (rt_expression_interface<double> *)(**(code **)(*(long *)val + 0x80))();
        rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
                  (prVar6,(rt_expression_interface<double> *)prVar4,poVar7,prVar5);
        local_10 = prVar6;
      }
      else {
        local_10 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)
                   (**(code **)(*(long *)val + 0x80))();
      }
    }
    else {
      prVar6 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
      rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
                ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)prVar6,0.0);
      local_10 = prVar6;
    }
  }
  return &local_10->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * simplify_impl(const InterfaceType * lhs, op_mult<NumericT>, const InterfaceType * rhs)
  {
        if (lhs->is_constant())
        {
          NumericT val = lhs->unwrap();
          if (val == 0.0)
            return new rt_constant<NumericT, InterfaceType>(0.0);
          if (val == 1.0)
            return rhs->simplify();

          return new rt_binary_expr<InterfaceType>(new rt_constant<NumericT, InterfaceType>(val),
                                                   new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                   rhs->simplify());
        }
        else if (rhs->is_constant())
        {
          NumericT val = rhs->unwrap();
          if (val == 0.0)
            return new rt_constant<NumericT, InterfaceType>(0.0);
          if (val == 1.0)
            return lhs->simplify();

          return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                   new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                   new rt_constant<NumericT, InterfaceType>(val));
        }

        rt_vector_expr<InterfaceType> const * lhs_vec = dynamic_cast<rt_vector_expr<InterfaceType> const *>(lhs);
        rt_vector_expr<InterfaceType> const * rhs_vec = dynamic_cast<rt_vector_expr<InterfaceType> const *>(rhs);

        if (lhs_vec != NULL && rhs_vec != NULL)
          return (*lhs_vec * *rhs_vec).get()->clone();

        return new rt_binary_expr<InterfaceType>(lhs->simplify(),
                                                 new op_binary<op_mult<NumericT>, InterfaceType>(),
                                                 rhs->simplify());
  }